

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

void secp256k1_dleq_serialize_point(uchar *buf33,secp256k1_ge *p)

{
  int iVar1;
  undefined1 local_68 [8];
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_ge *p_local;
  uchar *buf33_local;
  
  memcpy(y.n + 4,p,0x28);
  memcpy(local_68,&p->y,0x28);
  secp256k1_fe_normalize((secp256k1_fe *)local_68);
  iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)local_68);
  *buf33 = (uchar)iVar1;
  secp256k1_fe_normalize((secp256k1_fe *)(y.n + 4));
  secp256k1_fe_get_b32(buf33 + 1,(secp256k1_fe *)(y.n + 4));
  return;
}

Assistant:

static void secp256k1_dleq_serialize_point(unsigned char *buf33, const secp256k1_ge *p) {
    secp256k1_fe x = p->x;
    secp256k1_fe y = p->y;

    secp256k1_fe_normalize(&y);
    buf33[0] = secp256k1_fe_is_odd(&y);
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(&buf33[1], &x);
}